

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_request_pty(LIBSSH2_CHANNEL *channel,char *term,uint term_len,char *modes,uint modes_len
                       ,int width,int height,int width_px,int height_px)

{
  char cVar1;
  int iVar2;
  size_t sStack_60;
  uchar code;
  size_t data_len;
  uchar *data;
  uchar *puStack_48;
  int rc;
  uchar *s;
  LIBSSH2_SESSION *session;
  int width_local;
  uint modes_len_local;
  char *modes_local;
  char *pcStack_20;
  uint term_len_local;
  char *term_local;
  LIBSSH2_CHANNEL *channel_local;
  
  s = (uchar *)channel->session;
  session._0_4_ = width;
  session._4_4_ = modes_len;
  _width_local = modes;
  modes_local._4_4_ = term_len;
  pcStack_20 = term;
  term_local = (char *)channel;
  if (channel->reqPTY_state == libssh2_NB_state_idle) {
    if (0x100 < term_len + modes_len) {
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,-0x22,"term + mode lengths too large");
      return iVar2;
    }
    channel->reqPTY_packet_len = (ulong)(term_len + modes_len + 0x29);
    memset(&channel->reqPTY_packet_requirev_state,0,8);
    puStack_48 = (uchar *)(term_local + 0xb5);
    term_local[0xb4] = 'b';
    _libssh2_store_u32(&stack0xffffffffffffffb8,*(uint32_t *)(term_local + 0x4c));
    _libssh2_store_str(&stack0xffffffffffffffb8,"pty-req",7);
    *puStack_48 = '\x01';
    puStack_48 = puStack_48 + 1;
    _libssh2_store_str(&stack0xffffffffffffffb8,pcStack_20,(ulong)modes_local._4_4_);
    _libssh2_store_u32(&stack0xffffffffffffffb8,(uint32_t)session);
    _libssh2_store_u32(&stack0xffffffffffffffb8,height);
    _libssh2_store_u32(&stack0xffffffffffffffb8,width_px);
    _libssh2_store_u32(&stack0xffffffffffffffb8,height_px);
    _libssh2_store_str(&stack0xffffffffffffffb8,_width_local,(ulong)session._4_4_);
    term_local[0xb0] = '\x02';
    term_local[0xb1] = '\0';
    term_local[0xb2] = '\0';
    term_local[0xb3] = '\0';
  }
  if (*(int *)(term_local + 0xb0) == 2) {
    data._4_4_ = _libssh2_transport_send
                           ((LIBSSH2_SESSION *)s,(uchar *)(term_local + 0xb4),
                            *(size_t *)(term_local + 0x1e0),(uchar *)0x0,0);
    if (data._4_4_ == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)s,-0x25,"Would block sending pty request");
      return data._4_4_;
    }
    if (data._4_4_ != 0) {
      term_local[0xb0] = '\0';
      term_local[0xb1] = '\0';
      term_local[0xb2] = '\0';
      term_local[0xb3] = '\0';
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,data._4_4_,"Unable to send pty-request packet");
      return iVar2;
    }
    _libssh2_htonu32((uchar *)(term_local + 0x1e8),*(uint32_t *)(term_local + 0x38));
    term_local[0xb0] = '\x03';
    term_local[0xb1] = '\0';
    term_local[0xb2] = '\0';
    term_local[0xb3] = '\0';
  }
  if (*(int *)(term_local + 0xb0) == 3) {
    data._4_4_ = _libssh2_packet_requirev
                           ((LIBSSH2_SESSION *)s,"cd",(uchar **)&data_len,&stack0xffffffffffffffa0,1
                            ,(uchar *)(term_local + 0x1e8),4,
                            (packet_requirev_state_t *)(term_local + 0x1f0));
    if (data._4_4_ == -0x25) {
      return -0x25;
    }
    if ((data._4_4_ != 0) || (sStack_60 == 0)) {
      term_local[0xb0] = '\0';
      term_local[0xb1] = '\0';
      term_local[0xb2] = '\0';
      term_local[0xb3] = '\0';
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,-0xe,"Failed to require the PTY package");
      return iVar2;
    }
    cVar1 = *(char *)data_len;
    (**(code **)(s + 0x18))(data_len,s);
    term_local[0xb0] = '\0';
    term_local[0xb1] = '\0';
    term_local[0xb2] = '\0';
    term_local[0xb3] = '\0';
    if (cVar1 == 'c') {
      return 0;
    }
  }
  iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,-0x16,
                         "Unable to complete request for channel request-pty");
  return iVar2;
}

Assistant:

static int channel_request_pty(LIBSSH2_CHANNEL *channel,
                               const char *term, unsigned int term_len,
                               const char *modes, unsigned int modes_len,
                               int width, int height,
                               int width_px, int height_px)
{
    LIBSSH2_SESSION *session = channel->session;
    unsigned char *s;
    static const unsigned char reply_codes[3] =
        { SSH_MSG_CHANNEL_SUCCESS, SSH_MSG_CHANNEL_FAILURE, 0 };
    int rc;

    if(channel->reqPTY_state == libssh2_NB_state_idle) {
        /* 41 = packet_type(1) + channel(4) + pty_req_len(4) + "pty_req"(7) +
         * want_reply(1) + term_len(4) + width(4) + height(4) + width_px(4) +
         * height_px(4) + modes_len(4) */
        if(term_len + modes_len > 256) {
            return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                                  "term + mode lengths too large");
        }

        channel->reqPTY_packet_len = term_len + modes_len + 41;

        /* Zero the whole thing out */
        memset(&channel->reqPTY_packet_requirev_state, 0,
               sizeof(channel->reqPTY_packet_requirev_state));

        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Allocating tty on channel %u/%u", channel->local.id,
                       channel->remote.id));

        s = channel->reqPTY_packet;

        *(s++) = SSH_MSG_CHANNEL_REQUEST;
        _libssh2_store_u32(&s, channel->remote.id);
        _libssh2_store_str(&s, (const char *)"pty-req", sizeof("pty-req") - 1);

        *(s++) = 0x01;

        _libssh2_store_str(&s, term, term_len);
        _libssh2_store_u32(&s, width);
        _libssh2_store_u32(&s, height);
        _libssh2_store_u32(&s, width_px);
        _libssh2_store_u32(&s, height_px);
        _libssh2_store_str(&s, modes, modes_len);

        channel->reqPTY_state = libssh2_NB_state_created;
    }

    if(channel->reqPTY_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, channel->reqPTY_packet,
                                     channel->reqPTY_packet_len,
                                     NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, rc,
                           "Would block sending pty request");
            return rc;
        }
        else if(rc) {
            channel->reqPTY_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc,
                                  "Unable to send pty-request packet");
        }
        _libssh2_htonu32(channel->reqPTY_local_channel, channel->local.id);

        channel->reqPTY_state = libssh2_NB_state_sent;
    }

    if(channel->reqPTY_state == libssh2_NB_state_sent) {
        unsigned char *data;
        size_t data_len;
        unsigned char code;
        rc = _libssh2_packet_requirev(session, reply_codes, &data, &data_len,
                                      1, channel->reqPTY_local_channel, 4,
                                      &channel->reqPTY_packet_requirev_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc || data_len < 1) {
            channel->reqPTY_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                  "Failed to require the PTY package");
        }

        code = data[0];

        LIBSSH2_FREE(session, data);
        channel->reqPTY_state = libssh2_NB_state_idle;

        if(code == SSH_MSG_CHANNEL_SUCCESS)
            return 0;
    }

    return _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_REQUEST_DENIED,
                          "Unable to complete request for "
                          "channel request-pty");
}